

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkq.cpp
# Opt level: O2

void __thiscall
pg::ZLKQSolver::attractVertices(ZLKQSolver *this,int pl,int v,bitset *Z,bitset *R,bitset *Y)

{
  ulong *puVar1;
  uint vertex;
  Game *pGVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  int *piVar7;
  ulong uVar8;
  uint *puVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  _label_vertex local_68;
  bitset *local_58;
  bitset *local_50;
  bitset *local_48;
  _label_vertex local_40;
  
  pGVar2 = (this->super_Solver).game;
  puVar9 = (uint *)(pGVar2->_inedges + pGVar2->_firstins[v]);
  local_58 = R;
  local_50 = Z;
  local_48 = Y;
  do {
    vertex = *puVar9;
    uVar14 = (ulong)(int)vertex;
    if (uVar14 == 0xffffffffffffffff) {
      return;
    }
    uVar8 = uVar14 >> 6;
    if ((local_50->_bits[uVar8] >> (uVar14 & 0x3f) & 1) == 0) {
      uVar13 = 1L << (uVar14 & 0x3f);
      if ((local_58->_bits[uVar8] & uVar13) != 0) {
        iVar4 = Solver::owner(&this->super_Solver,vertex);
        if (iVar4 != pl) {
          pGVar2 = (this->super_Solver).game;
          bVar3 = false;
          for (piVar7 = pGVar2->_outedges + pGVar2->_firstouts[uVar14]; (!bVar3 && (*piVar7 != -1));
              piVar7 = piVar7 + 1) {
            uVar12 = (ulong)*piVar7;
            uVar11 = uVar12 >> 6;
            if ((local_50->_bits[uVar11] >> (uVar12 & 0x3f) & 1) == 0) {
              uVar12 = 1L << (uVar12 & 0x3f);
              if (((local_58->_bits[uVar11] & uVar12) == 0) &&
                 ((local_48->_bits[uVar11] & uVar12) == 0)) goto LAB_00144f86;
              bVar3 = true;
            }
            else {
LAB_00144f86:
              bVar3 = false;
            }
          }
          if (bVar3) goto LAB_001450a6;
        }
        puVar1 = local_50->_bits + uVar8;
        *puVar1 = *puVar1 | uVar13;
        iVar5 = Solver::owner(&this->super_Solver,vertex);
        iVar4 = -1;
        if (iVar5 == pl) {
          iVar4 = v;
        }
        this->str[uVar14] = iVar4;
        iVar4 = (this->Q).pointer;
        (this->Q).pointer = iVar4 + 1;
        (this->Q).queue[iVar4] = vertex;
        if (2 < (this->super_Solver).trace) {
          poVar6 = std::operator<<((this->super_Solver).logger,"\x1b[1;37mattracted \x1b[36m");
          local_68.g = (this->super_Solver).game;
          local_68.v = vertex;
          poVar6 = operator<<(poVar6,&local_68);
          poVar6 = std::operator<<(poVar6,"\x1b[m by \x1b[1;36m");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,pl);
          std::operator<<(poVar6,"\x1b[m");
          iVar4 = Solver::owner(&this->super_Solver,vertex);
          poVar6 = (this->super_Solver).logger;
          if (iVar4 == pl) {
            poVar6 = std::operator<<(poVar6," (via ");
            local_68.g = (this->super_Solver).game;
            local_68.v = v;
            poVar6 = operator<<(poVar6,&local_68);
            pcVar10 = ")";
          }
          else {
            pcVar10 = " (forced)";
          }
          poVar6 = std::operator<<(poVar6,pcVar10);
          std::endl<char,std::char_traits<char>>(poVar6);
        }
      }
    }
    else {
      iVar4 = Solver::owner(&this->super_Solver,vertex);
      if ((iVar4 == pl) && (piVar7 = this->str, piVar7[uVar14] == -1)) {
        if (2 < (this->super_Solver).trace) {
          poVar6 = std::operator<<((this->super_Solver).logger,
                                   "\x1b[1;37msetting strategy of \x1b[36m");
          local_68.g = (this->super_Solver).game;
          local_68.v = vertex;
          poVar6 = operator<<(poVar6,&local_68);
          poVar6 = std::operator<<(poVar6,"\x1b[m to \x1b[1;36m");
          local_40.g = (this->super_Solver).game;
          local_40.v = v;
          poVar6 = operator<<(poVar6,&local_40);
          poVar6 = std::operator<<(poVar6,"\x1b[m");
          std::endl<char,std::char_traits<char>>(poVar6);
          piVar7 = this->str;
        }
        piVar7[uVar14] = v;
      }
    }
LAB_001450a6:
    puVar9 = puVar9 + 1;
  } while( true );
}

Assistant:

void
ZLKQSolver::attractVertices(const int pl, const int v, bitset &Z, bitset &R, bitset &Y)
{
    auto curedge = ins(v);
    for (int from = *curedge; from != -1; from = *++curedge) {
        if (Z[from]) {
            // already in Z, set strategy if not yet set
            if (owner(from) == pl and str[from] == -1) {
#ifndef NDEBUG
                if (trace >= 3) {
                    logger << "\033[1;37msetting strategy of \033[36m" << label_vertex(from) << "\033[m to \033[1;36m" << label_vertex(v) << "\033[m" << std::endl;
                }
#endif
                str[from] = v;
            }
        } else if (R[from]) {
            // a vertex in <R> that is not yet in <Z>
            if (owner(from) != pl) {
                // check each exit
                bool escapes = false;
                auto curedge = outs(from);
                for (int to = *curedge; !escapes and to != -1; to = *++curedge) {
                    // check if escapes to a vertex in <R> or <Y> that is not in <Z>
                    if (!Z[to] and (R[to] or Y[to])) escapes = true;
                }
                if (escapes) continue;
            }
            // vertex does not escape, so attract it
            Z[from] = true;
            str[from] = owner(from) == pl ? v : -1;
            Q.push(from);
#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(from) << "\033[m by \033[1;36m" << pl << "\033[m";
                if (owner(from) == pl) logger << " (via " << label_vertex(v) << ")" << std::endl;
                else logger << " (forced)" << std::endl;
            }
#endif
        }
    }
}